

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaopen_base(lua_State *L)

{
  lua_State *L_local;
  
  base_open(L);
  luaL_register(L,"coroutine",co_funcs);
  return 2;
}

Assistant:

LUALIB_API int luaopen_base (lua_State *L) {
  base_open(L);
  luaL_register(L, LUA_COLIBNAME, co_funcs);
  return 2;
}